

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O1

void __thiscall
despot::SimpleRockSample::PrintBelief(SimpleRockSample *this,Belief *belief,ostream *out)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  double *pdVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  value_type_conflict1 *__val;
  double dVar8;
  
  plVar3 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  pdVar4 = (double *)operator_new(0x18);
  *pdVar4 = 0.0;
  pdVar4[1] = 0.0;
  pdVar4[2] = 0.0;
  lVar1 = *plVar3;
  lVar6 = plVar3[1] - lVar1;
  if (lVar6 == 0) {
    dVar8 = 0.0;
  }
  else {
    lVar6 = lVar6 >> 3;
    dVar8 = 0.0;
    lVar7 = 0;
    do {
      lVar2 = *(long *)(lVar1 + lVar7 * 8);
      dVar8 = dVar8 + (double)*(int *)(lVar2 + 0x24) * *(double *)(lVar2 + 0x18);
      pdVar4[*(int *)(lVar2 + 0x20)] = *(double *)(lVar2 + 0x18) + pdVar4[*(int *)(lVar2 + 0x20)];
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Rock belief: ",0xd);
  poVar5 = std::ostream::_M_insert<double>(dVar8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Position belief:",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(out," LEFT",5);
  std::__ostream_insert<char,std::char_traits<char>>(out,":",1);
  poVar5 = std::ostream::_M_insert<double>(*pdVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," MIDDLE",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  poVar5 = std::ostream::_M_insert<double>(pdVar4[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," RIGHT",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  poVar5 = std::ostream::_M_insert<double>(pdVar4[2]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  operator_delete(pdVar4,0x18);
  return;
}

Assistant:

void SimpleRockSample::PrintBelief(const Belief& belief, ostream& out) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief&>(belief).particles();

	double rock_status = 0;
	vector<double> pos_probs(3);
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		const SimpleState* state = static_cast<const SimpleState*>(particle);
		rock_status += state->rock_status * particle->weight;
		pos_probs[state->rover_position] += particle->weight;
	}

	out << "Rock belief: " << rock_status << endl;

	out << "Position belief:" << " LEFT" << ":" << pos_probs[0] << " MIDDLE"
		<< ":" << pos_probs[1] << " RIGHT" << ":" << pos_probs[2] << endl;
}